

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O0

bool __thiscall
QRasterPaintEnginePrivate::canUseFastImageBlending
          (QRasterPaintEnginePrivate *this,CompositionMode mode,QImage *image)

{
  bool bVar1;
  QRasterPaintEngineState *this_00;
  int in_ESI;
  QRasterPaintEnginePrivate *in_RDI;
  QRasterPaintEngineState *s;
  QRasterPaintEngine *q;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  q_func(in_RDI);
  this_00 = QRasterPaintEngine::state((QRasterPaintEngine *)0x56c39f);
  local_29 = 0;
  if ((*(ushort *)&this_00->field_12 >> 7 & 1) != 0) {
    local_2a = 1;
    if (in_ESI != 0) {
      local_2b = 0;
      if (in_ESI == 3) {
        bVar1 = QImage::hasAlphaChannel((QImage *)this_00);
        local_2b = bVar1 ^ 0xff;
      }
      local_2a = local_2b;
    }
    local_29 = local_2a;
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool QRasterPaintEnginePrivate::canUseFastImageBlending(QPainter::CompositionMode mode, const QImage &image) const
{
    Q_Q(const QRasterPaintEngine);
    const QRasterPaintEngineState *s = q->state();

    return s->flags.fast_images
           && (mode == QPainter::CompositionMode_SourceOver
               || (mode == QPainter::CompositionMode_Source
                   && !image.hasAlphaChannel()));
}